

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.h
# Opt level: O1

int lace_shrink_shared(WorkerP *w)

{
  Worker *pWVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  pWVar1 = w->_public;
  uVar3 = (pWVar1->ts).ts.tail;
  uVar2 = (pWVar1->ts).ts.split;
  if (uVar3 != uVar2) {
    uVar4 = uVar3 + uVar2 >> 1;
    (pWVar1->ts).ts.split = uVar4;
    uVar3 = (pWVar1->ts).ts.tail;
    if (uVar3 != uVar2) {
      if (uVar4 < uVar3) {
        uVar4 = uVar3 + uVar2 >> 1;
        (pWVar1->ts).ts.split = uVar4;
      }
      w->split = w->dq + uVar4;
      return 0;
    }
  }
  pWVar1->allstolen = '\x01';
  w->allstolen = '\x01';
  return 1;
}

Assistant:

static int
lace_shrink_shared(WorkerP *w)
{
    Worker *wt = w->_public;
    TailSplitNA ts; /* Use non-atomic version to emit better code */
    ts.v = wt->ts.v; /* Force in 1 memory read */
    uint32_t tail = ts.ts.tail;
    uint32_t split = ts.ts.split;

    if (tail != split) {
        uint32_t newsplit = (tail + split)/2;
        atomic_store_explicit(&wt->ts.ts.split, newsplit, memory_order_relaxed); /* emit normal write */
        atomic_thread_fence(memory_order_seq_cst);
        tail = wt->ts.ts.tail;
        if (tail != split) {
            if (unlikely(tail > newsplit)) {
                newsplit = (tail + split) / 2;
                atomic_store_explicit(&wt->ts.ts.split, newsplit, memory_order_relaxed); /* emit normal write */
            }
            w->split = w->dq + newsplit;
            PR_COUNTSPLITS(w, CTR_split_shrink);
            return 0;
        }
    }

    wt->allstolen = 1;
    w->allstolen = 1;
    return 1;
}